

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_IAB.cpp
# Opt level: O1

MXFWriter * __thiscall AS_02::IAB::MXFWriter::Finalize(MXFWriter *this)

{
  int iVar1;
  char cVar2;
  ILogSink *this_00;
  RuntimeError *this_01;
  long in_RSI;
  undefined1 *puVar3;
  int64_t tmp_pos;
  RuntimeError e;
  byte_t clip_buffer [8];
  undefined8 local_178;
  undefined1 local_170 [224];
  uint local_90 [26];
  
  iVar1 = *(int *)(*(long *)(in_RSI + 8) + 0x5a0);
  if (iVar1 != 3) {
    if (iVar1 == 0) {
      puVar3 = Kumu::RESULT_INIT;
    }
    else {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error
                (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_IAB.cpp"
                 ,0x137);
      puVar3 = Kumu::RESULT_STATE;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
    return this;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
  (**(code **)(*(long *)(*(long *)(in_RSI + 8) + 0x10) + 0x30))
            (local_90,*(long *)(in_RSI + 8) + 0x10,&local_178);
  Kumu::Result_t::~Result_t((Result_t *)local_90);
  Kumu::FileReader::Seek(local_170,*(long *)(in_RSI + 8) + 0x10,*(long *)(in_RSI + 0x10) + 0x10,0);
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_170);
  Kumu::Result_t::~Result_t((Result_t *)local_170);
  local_90[0] = 0;
  local_90[1] = 0;
  cVar2 = Kumu::write_BER((uchar *)local_90,*(long *)(*(long *)(in_RSI + 8) + 0x340) - 0x18,8);
  if (cVar2 == '\0') {
    this_01 = (RuntimeError *)__cxa_allocate_exception(0x78);
    Kumu::RuntimeError::RuntimeError(this_01,(Result_t *)Kumu::RESULT_FAIL);
  }
  else {
    Kumu::FileWriter::Write(local_170,(int)*(undefined8 *)(in_RSI + 8) + 0x10,local_90);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_170);
    Kumu::Result_t::~Result_t((Result_t *)local_170);
    if (*(int *)&this->_vptr_MXFWriter < 0) {
      this_01 = (RuntimeError *)__cxa_allocate_exception(0x78);
      Kumu::RuntimeError::RuntimeError(this_01,(Result_t *)this);
    }
    else {
      Kumu::FileReader::Seek(local_170,*(long *)(in_RSI + 8) + 0x10,local_178,0);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_170);
      Kumu::Result_t::~Result_t((Result_t *)local_170);
      if (*(int *)&this->_vptr_MXFWriter < 0) {
        this_01 = (RuntimeError *)__cxa_allocate_exception(0x78);
        Kumu::RuntimeError::RuntimeError(this_01,(Result_t *)this);
      }
      else {
        h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::WriteAS02Footer
                  ((h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *)local_170);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_170);
        Kumu::Result_t::~Result_t((Result_t *)local_170);
        if (-1 < *(int *)&this->_vptr_MXFWriter) {
          if (*(long **)(in_RSI + 8) != (long *)0x0) {
            (**(code **)(**(long **)(in_RSI + 8) + 8))();
          }
          *(undefined8 *)(in_RSI + 8) = 0;
          return this;
        }
        this_01 = (RuntimeError *)__cxa_allocate_exception(0x78);
        Kumu::RuntimeError::RuntimeError(this_01,(Result_t *)this);
      }
    }
  }
  __cxa_throw(this_01,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
}

Assistant:

Result_t
AS_02::IAB::MXFWriter::Finalize() {

  /* are we running */

  if (this->m_Writer->m_State == ST_BEGIN) {
    return Kumu::RESULT_INIT;
  }
  if (this->m_Writer->m_State != ST_RUNNING) {
    KM_RESULT_STATE_HERE();
    return RESULT_STATE;
  }


  Result_t result = RESULT_OK;

  try {

    /* write clip length */

    ui64_t current_position = this->m_Writer->m_File.TellPosition();

    result = this->m_Writer->m_File.Seek(m_ClipStart + ASDCP::SMPTE_UL_LENGTH);

    byte_t clip_buffer[CLIP_BER_LENGTH_SIZE] = { 0 };

    ui64_t size = static_cast<ui64_t>(this->m_Writer->m_StreamOffset) /* total size of the KLV */ - RESERVED_KL_SIZE;

    bool check = Kumu::write_BER(clip_buffer, size, CLIP_BER_LENGTH_SIZE);

    if (!check) {
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    result = this->m_Writer->m_File.Write(clip_buffer, CLIP_BER_LENGTH_SIZE);

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

    result = this->m_Writer->m_File.Seek(current_position);

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

    /* write footer */

    result = this->m_Writer->WriteAS02Footer();

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

  } catch (Kumu::RuntimeError e) {

    /* nothing to do since we are about to reset */

    result = e.GetResult();

  }

  /* we are ready to start again */

  this->Reset();

  return result;
}